

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_gc_mark_serialize_CALL(WorkerP *w,Task *__dq_head)

{
  long lVar1;
  long lVar2;
  avl_node_t *paVar3;
  long lVar4;
  void *pvVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  paVar3 = lddmc_ser_set;
  if (lddmc_ser_set != (avl_node_t *)0x0) {
    pvVar5 = malloc((ulong)(lddmc_ser_set->height + 1) * 8 + 8);
    *(avl_node_t **)((long)pvVar5 + 8) = paVar3;
    lVar8 = 0;
    do {
      puVar6 = *(undefined8 **)((long)pvVar5 + lVar8 * 8 + 8);
      while (puVar6 != (undefined8 *)0x0) {
        puVar6 = (undefined8 *)*puVar6;
        *(undefined8 **)((long)pvVar5 + lVar8 * 8 + 0x10) = puVar6;
        lVar8 = lVar8 + 1;
      }
      lVar1 = *(long *)((long)pvVar5 + lVar8 * 8);
      if (*(long *)(lVar1 + 8) == 0) {
        lVar4 = lVar8 + -1;
        lVar7 = lVar1;
        do {
          lVar8 = lVar4;
          if (lVar8 == 0) break;
          lVar2 = *(long *)((long)pvVar5 + lVar8 * 8);
          bVar9 = lVar7 == *(long *)(lVar2 + 8);
          lVar4 = lVar8 + -1;
          lVar7 = lVar2;
        } while (bVar9);
        *(undefined8 *)((long)pvVar5 + (lVar8 + -1) * 8 + 0x10) = 0;
        if (lVar1 == 0) {
          return;
        }
      }
      else {
        *(long *)((long)pvVar5 + lVar8 * 8 + 8) = *(long *)(lVar1 + 8);
      }
      lddmc_gc_mark_rec_CALL(w,__dq_head,*(MDD *)(lVar1 + 0x18));
    } while (*(long *)((long)pvVar5 + 8) != 0);
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(lddmc_gc_mark_serialize)
{
    struct lddmc_ser *s;
    avl_iter_t *it = lddmc_ser_iter(lddmc_ser_set);

    /* Iterate through nodes in serialization */
    while ((s=lddmc_ser_iter_next(it))) {
        CALL(lddmc_gc_mark_rec, s->mdd);
    }
}